

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmForEachCommand.cxx
# Opt level: O0

bool cmForEachCommand(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *args,cmExecutionStatus *status)

{
  bool bVar1;
  int iVar2;
  cmExecutionStatus *pcVar3;
  bool bVar4;
  size_type sVar5;
  const_reference pvVar6;
  reference this;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *p_Var7;
  pointer pcVar8;
  cmMakefile *pcVar9;
  int iVar10;
  anon_class_16_2_5155b745 __gen;
  unique_ptr<cmFunctionBlocker,_std::default_delete<cmFunctionBlocker>_> local_170;
  undefined1 *local_168;
  int iStack_160;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_158;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_150;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_148;
  undefined1 *puStack_140;
  anon_class_16_2_5155b745 generator;
  int cc;
  size_t iter_cnt;
  cmAlphaNum local_f0;
  string local_c0;
  undefined4 local_a0;
  int local_9c;
  int local_98;
  int step;
  int stop;
  int start;
  unique_ptr<(anonymous_namespace)::cmForEachFunctionBlocker,_std::default_delete<(anonymous_namespace)::cmForEachFunctionBlocker>_>
  local_88;
  __single_object fb;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_70;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_68;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_60;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  kwInIter;
  allocator<char> local_41;
  string local_40;
  cmExecutionStatus *local_20;
  cmExecutionStatus *status_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_local;
  
  local_20 = status;
  status_local = (cmExecutionStatus *)args;
  bVar4 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty(args);
  pcVar3 = local_20;
  if (bVar4) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_40,"called with incorrect number of arguments",&local_41);
    cmExecutionStatus::SetError(pcVar3,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    std::allocator<char>::~allocator(&local_41);
    args_local._7_1_ = 0;
    goto LAB_005eca97;
  }
  local_68._M_current =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)status_local);
  local_70 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)status_local);
  local_60 = std::
             find<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,char[3]>
                       (local_68,(__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                  )local_70,(char (*) [3])0xdb2b3f);
  local_78._M_current =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)status_local);
  bVar4 = __gnu_cxx::operator!=(&local_60,&local_78);
  pcVar3 = status_local;
  if (bVar4) {
    fb._M_t.
    super___uniq_ptr_impl<(anonymous_namespace)::cmForEachFunctionBlocker,_std::default_delete<(anonymous_namespace)::cmForEachFunctionBlocker>_>
    ._M_t.
    super__Tuple_impl<0UL,_(anonymous_namespace)::cmForEachFunctionBlocker_*,_std::default_delete<(anonymous_namespace)::cmForEachFunctionBlocker>_>
    .super__Head_base<0UL,_(anonymous_namespace)::cmForEachFunctionBlocker_*,_false>._M_head_impl =
         (__uniq_ptr_data<(anonymous_namespace)::cmForEachFunctionBlocker,_std::default_delete<(anonymous_namespace)::cmForEachFunctionBlocker>,_true,_true>
          )(__uniq_ptr_data<(anonymous_namespace)::cmForEachFunctionBlocker,_std::default_delete<(anonymous_namespace)::cmForEachFunctionBlocker>,_true,_true>
            )local_60._M_current;
    pcVar9 = cmExecutionStatus::GetMakefile(local_20);
    args_local._7_1_ =
         anon_unknown.dwarf_aeb9f5::HandleInMode
                   ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)pcVar3,
                    (const_iterator)
                    fb._M_t.
                    super___uniq_ptr_impl<(anonymous_namespace)::cmForEachFunctionBlocker,_std::default_delete<(anonymous_namespace)::cmForEachFunctionBlocker>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_(anonymous_namespace)::cmForEachFunctionBlocker_*,_std::default_delete<(anonymous_namespace)::cmForEachFunctionBlocker>_>
                    .super__Head_base<0UL,_(anonymous_namespace)::cmForEachFunctionBlocker_*,_false>
                    ._M_head_impl,pcVar9);
    goto LAB_005eca97;
  }
  _stop = cmExecutionStatus::GetMakefile(local_20);
  std::make_unique<(anonymous_namespace)::cmForEachFunctionBlocker,cmMakefile*>
            ((cmMakefile **)&local_88);
  sVar5 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)status_local);
  pcVar3 = status_local;
  if (sVar5 < 2) {
    pcVar8 = std::
             unique_ptr<(anonymous_namespace)::cmForEachFunctionBlocker,_std::default_delete<(anonymous_namespace)::cmForEachFunctionBlocker>_>
             ::operator->(&local_88);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator=(&pcVar8->Args,
                (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)pcVar3);
LAB_005ec9f5:
    pcVar8 = std::
             unique_ptr<(anonymous_namespace)::cmForEachFunctionBlocker,_std::default_delete<(anonymous_namespace)::cmForEachFunctionBlocker>_>
             ::operator->(&local_88);
    anon_unknown.dwarf_aeb9f5::cmForEachFunctionBlocker::SetIterationVarsCount(pcVar8,1);
    pcVar9 = cmExecutionStatus::GetMakefile(local_20);
    std::unique_ptr<cmFunctionBlocker,std::default_delete<cmFunctionBlocker>>::
    unique_ptr<(anonymous_namespace)::cmForEachFunctionBlocker,std::default_delete<(anonymous_namespace)::cmForEachFunctionBlocker>,void>
              ((unique_ptr<cmFunctionBlocker,std::default_delete<cmFunctionBlocker>> *)&local_170,
               &local_88);
    cmMakefile::AddFunctionBlocker(pcVar9,&local_170);
    std::unique_ptr<cmFunctionBlocker,_std::default_delete<cmFunctionBlocker>_>::~unique_ptr
              (&local_170);
    args_local._7_1_ = 1;
  }
  else {
    pvVar6 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)status_local,1);
    bVar4 = std::operator==(pvVar6,"RANGE");
    pcVar3 = status_local;
    if (!bVar4) {
      pcVar8 = std::
               unique_ptr<(anonymous_namespace)::cmForEachFunctionBlocker,_std::default_delete<(anonymous_namespace)::cmForEachFunctionBlocker>_>
               ::operator->(&local_88);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator=(&pcVar8->Args,
                  (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)pcVar3);
      goto LAB_005ec9f5;
    }
    step = 0;
    local_98 = 0;
    local_9c = 0;
    sVar5 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)status_local);
    pcVar3 = local_20;
    if (sVar5 == 3) {
      pvVar6 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)status_local,2);
      bVar4 = anon_unknown.dwarf_aeb9f5::TryParseInteger(pcVar3,pvVar6,&local_98);
      if (bVar4) goto LAB_005ec50f;
      args_local._7_1_ = 0;
    }
    else {
LAB_005ec50f:
      sVar5 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)status_local);
      pcVar3 = local_20;
      if (sVar5 == 4) {
        pvVar6 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)status_local,2);
        bVar4 = anon_unknown.dwarf_aeb9f5::TryParseInteger(pcVar3,pvVar6,&step);
        pcVar3 = local_20;
        if (bVar4) {
          pvVar6 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)status_local,3);
          bVar4 = anon_unknown.dwarf_aeb9f5::TryParseInteger(pcVar3,pvVar6,&local_98);
          if (bVar4) goto LAB_005ec5d0;
          args_local._7_1_ = 0;
        }
        else {
          args_local._7_1_ = 0;
        }
      }
      else {
LAB_005ec5d0:
        sVar5 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)status_local);
        pcVar3 = local_20;
        if (sVar5 == 5) {
          pvVar6 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)status_local,2);
          bVar4 = anon_unknown.dwarf_aeb9f5::TryParseInteger(pcVar3,pvVar6,&step);
          pcVar3 = local_20;
          if (bVar4) {
            pvVar6 = std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   *)status_local,3);
            bVar4 = anon_unknown.dwarf_aeb9f5::TryParseInteger(pcVar3,pvVar6,&local_98);
            pcVar3 = local_20;
            if (bVar4) {
              pvVar6 = std::
                       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     *)status_local,4);
              bVar4 = anon_unknown.dwarf_aeb9f5::TryParseInteger(pcVar3,pvVar6,&local_9c);
              if (bVar4) goto LAB_005ec6e7;
              args_local._7_1_ = 0;
            }
            else {
              args_local._7_1_ = 0;
            }
          }
          else {
            args_local._7_1_ = 0;
          }
        }
        else {
LAB_005ec6e7:
          pcVar3 = local_20;
          if (local_9c == 0) {
            if (local_98 < step) {
              local_9c = -1;
            }
            else {
              local_9c = 1;
            }
          }
          if ((((step <= local_98) || (local_9c < 1)) && ((local_98 <= step || (-1 < local_9c)))) &&
             (local_9c != 0)) {
            iVar10 = step - local_98;
            bVar4 = step < local_98;
            bVar1 = local_98 <= step;
            iVar2 = local_9c;
            if (local_9c < 1) {
              iVar2 = -local_9c;
            }
            pcVar8 = std::
                     unique_ptr<(anonymous_namespace)::cmForEachFunctionBlocker,_std::default_delete<(anonymous_namespace)::cmForEachFunctionBlocker>_>
                     ::operator->(&local_88);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::resize(&pcVar8->Args,
                     (ulong)(uint)((int)((uint)bVar4 * -iVar10) / iVar2 + 2 +
                                  (int)((uint)(iVar10 != 0 && bVar1) * iVar10) / iVar2));
            pvVar6 = std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::front((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)status_local);
            pcVar8 = std::
                     unique_ptr<(anonymous_namespace)::cmForEachFunctionBlocker,_std::default_delete<(anonymous_namespace)::cmForEachFunctionBlocker>_>
                     ::operator->(&local_88);
            this = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::front(&pcVar8->Args);
            std::__cxx11::string::operator=((string *)this,(string *)pvVar6);
            generator._12_4_ = step;
            puStack_140 = &generator.field_0xc;
            generator.cc._0_4_ = local_9c;
            pcVar8 = std::
                     unique_ptr<(anonymous_namespace)::cmForEachFunctionBlocker,_std::default_delete<(anonymous_namespace)::cmForEachFunctionBlocker>_>
                     ::operator->(&local_88);
            local_150._M_current =
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::begin(&pcVar8->Args);
            p_Var7 = __gnu_cxx::
                     __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ::operator++(&local_150);
            local_148._M_current = p_Var7->_M_current;
            pcVar8 = std::
                     unique_ptr<(anonymous_namespace)::cmForEachFunctionBlocker,_std::default_delete<(anonymous_namespace)::cmForEachFunctionBlocker>_>
                     ::operator->(&local_88);
            local_158 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        std::
                        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ::end(&pcVar8->Args);
            local_168 = puStack_140;
            iStack_160 = (int)generator.cc;
            __gen.step = (int)generator.cc;
            __gen.cc = (int *)puStack_140;
            __gen._12_4_ = 0;
            std::
            generate<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,cmForEachCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::__0>
                      (local_148,
                       (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        )local_158,__gen);
            goto LAB_005ec9f5;
          }
          cmAlphaNum::cmAlphaNum(&local_f0,"called with incorrect range specification: start ");
          cmAlphaNum::cmAlphaNum((cmAlphaNum *)&iter_cnt,step);
          cmStrCat<char[8],int,char[8],int>
                    (&local_c0,&local_f0,(cmAlphaNum *)&iter_cnt,(char (*) [8])", stop ",&local_98,
                     (char (*) [8])", step ",&local_9c);
          cmExecutionStatus::SetError(pcVar3,&local_c0);
          std::__cxx11::string::~string((string *)&local_c0);
          cmSystemTools::SetFatalErrorOccurred();
          args_local._7_1_ = 0;
        }
      }
    }
  }
  local_a0 = 1;
  std::
  unique_ptr<(anonymous_namespace)::cmForEachFunctionBlocker,_std::default_delete<(anonymous_namespace)::cmForEachFunctionBlocker>_>
  ::~unique_ptr(&local_88);
LAB_005eca97:
  return (bool)(args_local._7_1_ & 1);
}

Assistant:

bool cmForEachCommand(std::vector<std::string> const& args,
                      cmExecutionStatus& status)
{
  if (args.empty()) {
    status.SetError("called with incorrect number of arguments");
    return false;
  }
  auto kwInIter = std::find(args.begin(), args.end(), "IN");
  if (kwInIter != args.end()) {
    return HandleInMode(args, kwInIter, status.GetMakefile());
  }

  // create a function blocker
  auto fb = cm::make_unique<cmForEachFunctionBlocker>(&status.GetMakefile());
  if (args.size() > 1) {
    if (args[1] == "RANGE") {
      int start = 0;
      int stop = 0;
      int step = 0;
      if (args.size() == 3) {
        if (!TryParseInteger(status, args[2], stop)) {
          return false;
        }
      }
      if (args.size() == 4) {
        if (!TryParseInteger(status, args[2], start)) {
          return false;
        }
        if (!TryParseInteger(status, args[3], stop)) {
          return false;
        }
      }
      if (args.size() == 5) {
        if (!TryParseInteger(status, args[2], start)) {
          return false;
        }
        if (!TryParseInteger(status, args[3], stop)) {
          return false;
        }
        if (!TryParseInteger(status, args[4], step)) {
          return false;
        }
      }
      if (step == 0) {
        if (start > stop) {
          step = -1;
        } else {
          step = 1;
        }
      }
      if ((start > stop && step > 0) || (start < stop && step < 0) ||
          step == 0) {
        status.SetError(
          cmStrCat("called with incorrect range specification: start ", start,
                   ", stop ", stop, ", step ", step));
        cmSystemTools::SetFatalErrorOccurred();
        return false;
      }

      // Calculate expected iterations count and reserve enough space
      // in the `fb->Args` vector. The first item is the iteration variable
      // name...
      const std::size_t iter_cnt = 2u +
        static_cast<int>(start < stop) * (stop - start) / std::abs(step) +
        static_cast<int>(start > stop) * (start - stop) / std::abs(step);
      fb->Args.resize(iter_cnt);
      fb->Args.front() = args.front();
      auto cc = start;
      auto generator = [&cc, step]() -> std::string {
        auto result = std::to_string(cc);
        cc += step;
        return result;
      };
      // Fill the `range` vector w/ generated string values
      // (starting from 2nd position)
      std::generate(++fb->Args.begin(), fb->Args.end(), generator);
    } else {
      fb->Args = args;
    }
  } else {
    fb->Args = args;
  }

  fb->SetIterationVarsCount(1u);
  status.GetMakefile().AddFunctionBlocker(std::move(fb));

  return true;
}